

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemX_cursor.cpp
# Opt level: O1

void __thiscall
Am_Cursor_Data::Am_Cursor_Data
          (Am_Cursor_Data *this,Am_Image_Array *im,Am_Image_Array *m,Am_Style *fg_col,
          Am_Style *bg_col)

{
  (this->super_Am_Wrapper).refs = 1;
  (this->super_Am_Wrapper).super_Am_Registered_Type._vptr_Am_Registered_Type =
       (_func_int **)&PTR_ID_002e43e0;
  Am_Image_Array::Am_Image_Array(&this->image);
  Am_Image_Array::Am_Image_Array(&this->mask);
  Am_Style::Am_Style(&this->fg_color);
  Am_Style::Am_Style(&this->bg_color);
  this->main_display = (Display *)0x0;
  this->main_cursor = 0;
  Am_Image_Array::operator=(&this->image,im);
  Am_Image_Array::operator=(&this->mask,m);
  Am_Style::operator=(&this->fg_color,fg_col);
  Am_Style::operator=(&this->bg_color,bg_col);
  this->head = (Cursor_Item *)0x0;
  this->next = list;
  list = this;
  this->x_hot = -1;
  this->y_hot = -1;
  return;
}

Assistant:

Am_Cursor_Data::Am_Cursor_Data(Am_Image_Array im, Am_Image_Array m,
                               Am_Style fg_col, Am_Style bg_col)
{
  main_display = nullptr;
  main_cursor = 0;
  image = im;
  mask = m;
  fg_color = fg_col;
  bg_color = bg_col;
  head = nullptr;
  next = list;
  list = this;
  x_hot = y_hot = -1;
}